

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddBridge.c
# Opt level: O2

DdNode * cuddBddTransferRecur(DdManager *ddS,DdManager *ddD,DdNode *f,st__table *table)

{
  int *piVar1;
  int iVar2;
  abctime aVar3;
  DdNode *h;
  DdNode *pDVar4;
  ulong uVar5;
  DdNode *pDVar6;
  int *key;
  DdNode *res;
  DdNode *local_50;
  DdNode *local_48;
  int local_3c;
  DdNode *local_38;
  
  pDVar6 = ddD->one;
  key = (int *)((ulong)f & 0xfffffffffffffffe);
  uVar5 = (ulong)((uint)f & 1);
  if (*key == 0x7fffffff) {
    pDVar6 = (DdNode *)(uVar5 ^ (ulong)pDVar6);
  }
  else {
    iVar2 = st__lookup(table,(char *)key,(char **)&local_50);
    if (iVar2 == 0) {
      if (((ddS->TimeStop == 0) || (aVar3 = Abc_Clock(), aVar3 <= ddS->TimeStop)) &&
         ((ddD->TimeStop == 0 || (aVar3 = Abc_Clock(), aVar3 <= ddD->TimeStop)))) {
        local_3c = *key;
        local_38 = *(DdNode **)(key + 6);
        local_48 = cuddBddTransferRecur(ddS,ddD,*(DdNode **)(key + 4),table);
        if (local_48 != (DdNode *)0x0) {
          piVar1 = (int *)(((ulong)local_48 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          h = cuddBddTransferRecur(ddS,ddD,local_38,table);
          pDVar4 = local_48;
          if (h != (DdNode *)0x0) {
            piVar1 = (int *)(((ulong)h & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + 1;
            pDVar4 = cuddUniqueInter(ddD,local_3c,pDVar6,(DdNode *)((ulong)pDVar6 ^ 1));
            pDVar6 = local_48;
            if ((pDVar4 == (DdNode *)0x0) ||
               (local_50 = cuddBddIteRecur(ddD,pDVar4,local_48,h), local_50 == (DdNode *)0x0)) {
              Cudd_RecursiveDeref(ddD,pDVar6);
              pDVar4 = h;
            }
            else {
              piVar1 = (int *)(((ulong)local_50 & 0xfffffffffffffffe) + 4);
              *piVar1 = *piVar1 + 1;
              Cudd_RecursiveDeref(ddD,pDVar6);
              Cudd_RecursiveDeref(ddD,h);
              iVar2 = st__add_direct(table,(char *)key,(char *)local_50);
              pDVar4 = local_50;
              if (iVar2 != -10000) {
                return (DdNode *)(uVar5 ^ (ulong)local_50);
              }
            }
          }
          Cudd_RecursiveDeref(ddD,pDVar4);
        }
      }
      pDVar6 = (DdNode *)0x0;
    }
    else {
      pDVar6 = (DdNode *)(uVar5 ^ (ulong)local_50);
    }
  }
  return pDVar6;
}

Assistant:

static DdNode *
cuddBddTransferRecur(
  DdManager * ddS,
  DdManager * ddD,
  DdNode * f,
  st__table * table)
{
    DdNode *ft, *fe, *t, *e, *var, *res;
    DdNode *one, *zero;
    int    index;
    int    comple = 0;

    statLine(ddD);
    one = DD_ONE(ddD);
    comple = Cudd_IsComplement(f);

    /* Trivial cases. */
    if (Cudd_IsConstant(f)) return(Cudd_NotCond(one, comple));

    /* Make canonical to increase the utilization of the cache. */
    f = Cudd_NotCond(f,comple);
    /* Now f is a regular pointer to a non-constant node. */

    /* Check the cache. */
    if ( st__lookup(table, (const char *)f, (char **)&res))
        return(Cudd_NotCond(res,comple));

    if ( ddS->TimeStop && Abc_Clock() > ddS->TimeStop )
        return NULL;
    if ( ddD->TimeStop && Abc_Clock() > ddD->TimeStop )
        return NULL;
    
    /* Recursive step. */
    index = f->index;
    ft = cuddT(f); fe = cuddE(f);

    t = cuddBddTransferRecur(ddS, ddD, ft, table);
    if (t == NULL) {
        return(NULL);
    }
    cuddRef(t);

    e = cuddBddTransferRecur(ddS, ddD, fe, table);
    if (e == NULL) {
        Cudd_RecursiveDeref(ddD, t);
        return(NULL);
    }
    cuddRef(e);

    zero = Cudd_Not(one);
    var = cuddUniqueInter(ddD,index,one,zero);
    if (var == NULL) {
        Cudd_RecursiveDeref(ddD, t);
        Cudd_RecursiveDeref(ddD, e);
        return(NULL);
    }
    res = cuddBddIteRecur(ddD,var,t,e);
    if (res == NULL) {
        Cudd_RecursiveDeref(ddD, t);
        Cudd_RecursiveDeref(ddD, e);
        return(NULL);
    }
    cuddRef(res);
    Cudd_RecursiveDeref(ddD, t);
    Cudd_RecursiveDeref(ddD, e);

    if ( st__add_direct(table, (char *) f, (char *) res) == st__OUT_OF_MEM) {
        Cudd_RecursiveDeref(ddD, res);
        return(NULL);
    }
    return(Cudd_NotCond(res,comple));

}